

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_4::Validator::Validator
          (Validator *this,Errors *errors,Module *module,ValidateOptions *options)

{
  ValidateOptions *options_local;
  Module *module_local;
  Errors *errors_local;
  Validator *this_local;
  
  ExprVisitor::Delegate::Delegate(&this->super_Delegate);
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__Validator_0046bce8;
  this->options_ = options;
  this->errors_ = errors;
  SharedValidator::SharedValidator(&this->validator_,this->errors_,this->options_);
  this->current_module_ = module;
  Result::Result(&this->result_,Ok);
  return;
}

Assistant:

Validator::Validator(Errors* errors,
                     const Module* module,
                     const ValidateOptions& options)
    : options_(options),
      errors_(errors),
      validator_(errors_, options_),
      current_module_(module) {}